

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLatch.c
# Opt level: O1

void Abc_NtkTransformBack
               (Abc_Ntk_t *pNtkOld,Abc_Ntk_t *pNtkNew,Vec_Ptr_t *vControls,Vec_Int_t *vClasses)

{
  int iVar1;
  uint uVar2;
  long *plVar3;
  long *plVar4;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pFanin_00;
  long lVar5;
  Vec_Ptr_t *pVVar6;
  Abc_Obj_t *pObj;
  char *pcVar7;
  
  if (pNtkOld->vPos->nSize != pNtkNew->vPos->nSize) {
    __assert_fail("Abc_NtkPoNum(pNtkOld) == Abc_NtkPoNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcLatch.c"
                  ,0x25b,
                  "void Abc_NtkTransformBack(Abc_Ntk_t *, Abc_Ntk_t *, Vec_Ptr_t *, Vec_Int_t *)");
  }
  pVVar6 = pNtkOld->vPos;
  if (0 < pVVar6->nSize) {
    lVar5 = 0;
    do {
      if (pNtkNew->vPos->nSize <= lVar5) goto LAB_001e4099;
      *(void **)((long)pVVar6->pArray[lVar5] + 0x40) = pNtkNew->vPos->pArray[lVar5];
      lVar5 = lVar5 + 1;
      pVVar6 = pNtkOld->vPos;
    } while (lVar5 < pVVar6->nSize);
  }
  iVar1 = vControls->nSize;
  if (0 < (long)iVar1) {
    lVar5 = 0;
    do {
      plVar3 = (long *)vControls->pArray[lVar5];
      if (((*(uint *)((long)plVar3 + 0x14) & 0xf) != 3) || ((Abc_Ntk_t *)*plVar3 != pNtkOld)) {
        __assert_fail("Abc_ObjIsPo(pObj) && pObj->pNtk == pNtkOld",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcLatch.c"
                      ,0x262,
                      "void Abc_NtkTransformBack(Abc_Ntk_t *, Abc_Ntk_t *, Vec_Ptr_t *, Vec_Int_t *)"
                     );
      }
      vControls->pArray[lVar5] = (void *)plVar3[8];
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  if (pNtkNew->nObjCounts[8] != vClasses->nSize) {
    __assert_fail("Abc_NtkLatchNum(pNtkNew) == Vec_IntSize(vClasses)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcLatch.c"
                  ,0x266,
                  "void Abc_NtkTransformBack(Abc_Ntk_t *, Abc_Ntk_t *, Vec_Ptr_t *, Vec_Int_t *)");
  }
  pVVar6 = pNtkNew->vBoxes;
  if (0 < pVVar6->nSize) {
    lVar5 = 0;
    do {
      plVar3 = (long *)pVVar6->pArray[lVar5];
      if ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 8) {
        if (vClasses->nSize <= lVar5) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar2 = vClasses->pArray[lVar5];
        if ((ulong)uVar2 != 0xffffffff) {
          if (((int)uVar2 < 0) || (vControls->nSize <= (int)uVar2)) {
LAB_001e4099:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          plVar4 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8
                             );
          pFanin = *(Abc_Obj_t **)
                    (*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[4] * 8);
          pFanin_00 = *(Abc_Obj_t **)
                       (*(long *)(*(long *)(*vControls->pArray[uVar2] + 0x20) + 8) +
                       (long)**(int **)((long)vControls->pArray[uVar2] + 0x20) * 8);
          pObj = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_NODE);
          Abc_ObjAddFanin(pObj,pFanin_00);
          Abc_ObjAddFanin(pObj,pFanin);
          Abc_ObjAddFanin(pObj,*(Abc_Obj_t **)
                                (*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                (long)*(int *)plVar3[6] * 8));
          pcVar7 = Abc_SopRegister((Mem_Flex_t *)pNtkNew->pManFunc,"0-1 1\n11- 1\n");
          (pObj->field_5).pData = pcVar7;
          Abc_ObjPatchFanin(*(Abc_Obj_t **)
                             (*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8
                             ),pFanin,pObj);
        }
      }
      lVar5 = lVar5 + 1;
      pVVar6 = pNtkNew->vBoxes;
    } while (lVar5 < pVVar6->nSize);
  }
  if (0 < vControls->nSize) {
    lVar5 = 0;
    do {
      Abc_NtkDeleteObj((Abc_Obj_t *)vControls->pArray[lVar5]);
      lVar5 = lVar5 + 1;
    } while (lVar5 < vControls->nSize);
  }
  return;
}

Assistant:

void Abc_NtkTransformBack( Abc_Ntk_t * pNtkOld, Abc_Ntk_t * pNtkNew, Vec_Ptr_t * vControls, Vec_Int_t * vClasses )
{
    Abc_Obj_t * pObj, * pNodeNew, * pCtrl, * pDriver;
    int i, Class;
    assert( Abc_NtkPoNum(pNtkOld) == Abc_NtkPoNum(pNtkNew) );
    // match the POs of the old into new
    Abc_NtkForEachPo( pNtkOld, pObj, i )
        pObj->pCopy = Abc_NtkPo( pNtkNew, i );
    // remap the flops
    Vec_PtrForEachEntry( Abc_Obj_t *, vControls, pObj, i )
    {
        assert( Abc_ObjIsPo(pObj) && pObj->pNtk == pNtkOld );
        Vec_PtrWriteEntry( vControls, i, pObj->pCopy );
    }
    // create self-loops
    assert( Abc_NtkLatchNum(pNtkNew) == Vec_IntSize(vClasses) );
    Abc_NtkForEachLatch( pNtkNew, pObj, i )
    {
        Class = Vec_IntEntry( vClasses, i );
        if ( Class == -1 )
            continue;
        pDriver = Abc_ObjFanin0(Abc_ObjFanin0(pObj));
        pCtrl = (Abc_Obj_t *)Vec_PtrEntry( vControls, Class );
        pCtrl = Abc_ObjFanin0( pCtrl );
        pNodeNew = Abc_NtkCreateNode( pNtkNew );
        Abc_ObjAddFanin( pNodeNew, pCtrl );
        Abc_ObjAddFanin( pNodeNew, pDriver );
        Abc_ObjAddFanin( pNodeNew, Abc_ObjFanout0(pObj) );
        Abc_ObjSetData( pNodeNew, Abc_SopRegister((Mem_Flex_t *)pNtkNew->pManFunc, "0-1 1\n11- 1\n") );
        Abc_ObjPatchFanin( Abc_ObjFanin0(pObj), pDriver, pNodeNew );
    }
    // remove the useless POs
    Vec_PtrForEachEntry( Abc_Obj_t *, vControls, pObj, i )
        Abc_NtkDeleteObj( pObj );
}